

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void add_to_hit(artifact *art,wchar_t fixed,wchar_t random)

{
  uint32_t uVar1;
  wchar_t random_local;
  wchar_t fixed_local;
  artifact *art_local;
  
  if (art->to_h < 0x1b) {
    if ((0x10 < art->to_h) && (uVar1 = Rand_div(2), uVar1 != 0)) {
      file_putf(log_file,"Failed to add to-hit, value %d is too high\n",(ulong)(uint)art->to_h);
      return;
    }
  }
  else {
    uVar1 = Rand_div(6);
    if (uVar1 != 0) {
      file_putf(log_file,"Failed to add to-hit, value %d is too high\n",(ulong)(uint)art->to_h);
      return;
    }
  }
  uVar1 = Rand_div(random);
  art->to_h = (int)(short)((short)fixed + (short)uVar1) + art->to_h;
  file_putf(log_file,"Adding ability: extra to_h (now %+d)\n",(ulong)(uint)art->to_h);
  return;
}

Assistant:

static void add_to_hit(struct artifact *art, int fixed, int random)
{
	/* Inhibit above certain threshholds */
	if (art->to_h > VERYHIGH_TO_HIT) {
		if (!INHIBIT_STRONG) {
			file_putf(log_file, "Failed to add to-hit, value %d is too high\n",
					  art->to_h);
			return;
		}
	} else if (art->to_h > HIGH_TO_HIT) {
		if (!INHIBIT_WEAK) {
			file_putf(log_file, "Failed to add to-hit, value %d is too high\n",
					  art->to_h);
			return;
		}
	}
	art->to_h += (int16_t)(fixed + randint0(random));
	file_putf(log_file, "Adding ability: extra to_h (now %+d)\n", art->to_h);
}